

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O3

void __thiscall
duckdb::WindowBuilder::WindowBuilder(WindowBuilder *this,WindowCollection *collection)

{
  this->collection = collection;
  (this->sink).first = 0;
  (this->sink).second.ptr = (ColumnDataCollection *)0x0;
  (this->appender).current_chunk_state.handles._M_h._M_buckets =
       &(this->appender).current_chunk_state.handles._M_h._M_single_bucket;
  (this->appender).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->appender).current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->appender).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->appender).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->appender).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->appender).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->appender).current_chunk_state.properties = INVALID;
  (this->appender).vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->appender).vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->appender).vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->all_valid = true;
  return;
}

Assistant:

WindowBuilder::WindowBuilder(WindowCollection &collection) : collection(collection) {
}